

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# lbbox.h
# Opt level: O0

void __thiscall
embree::LBBox<embree::Vec3fa>::LBBox(LBBox<embree::Vec3fa> *this,avector<BBox<Vec3fa>_> *bounds)

{
  undefined8 uVar1;
  undefined8 uVar2;
  undefined8 *puVar3;
  long in_RSI;
  undefined8 *in_RDI;
  undefined1 auVar4 [16];
  float fVar5;
  undefined1 auVar6 [16];
  Vec3fa dupper;
  Vec3fa dlower;
  BBox<embree::Vec3fa> bt;
  float f;
  size_t i;
  BBox<embree::Vec3fa> b1;
  BBox<embree::Vec3fa> b0;
  float local_a54;
  float local_a4c;
  ulong local_9a0;
  anon_union_16_2_47237d3f_for_Vec3fa_0 local_998;
  undefined8 local_988;
  undefined8 uStack_980;
  anon_union_16_2_47237d3f_for_Vec3fa_0 local_978;
  undefined8 local_968;
  undefined8 uStack_960;
  long local_958;
  undefined8 *local_7f8;
  undefined8 *local_7f0;
  undefined8 *local_7e8;
  undefined8 *local_7e0;
  undefined8 local_7d8;
  undefined8 uStack_7d0;
  undefined8 local_768;
  undefined8 uStack_760;
  float local_688;
  float fStack_684;
  float fStack_680;
  float fStack_67c;
  float local_638;
  float fStack_634;
  float fStack_630;
  float fStack_62c;
  long local_318;
  float local_2e8;
  float fStack_2e4;
  float fStack_2e0;
  float fStack_2dc;
  float local_2d8;
  float fStack_2d4;
  float fStack_2d0;
  float fStack_2cc;
  float local_288;
  float fStack_284;
  float fStack_280;
  float fStack_27c;
  float local_1d8;
  float fStack_1d4;
  float fStack_1d0;
  float fStack_1cc;
  float local_158;
  float fStack_154;
  float fStack_150;
  float fStack_14c;
  float local_148;
  float fStack_144;
  float fStack_140;
  float fStack_13c;
  float local_b8;
  float fStack_b4;
  float fStack_b0;
  float fStack_ac;
  float local_38;
  float fStack_34;
  float fStack_30;
  float fStack_2c;
  
  local_7f8 = in_RDI + 2;
  local_7f0 = in_RDI + 4;
  local_7e0 = in_RDI + 6;
  local_958 = in_RSI;
  local_7e8 = local_7f0;
  BBox<embree::Vec3fa>::BBox
            ((BBox<embree::Vec3fa> *)&local_978.field_1,*(BBox<embree::Vec3fa> **)(in_RSI + 0x18));
  local_318 = local_958;
  BBox<embree::Vec3fa>::BBox
            ((BBox<embree::Vec3fa> *)&local_998.field_1,
             (BBox<embree::Vec3fa> *)
             (*(long *)(local_958 + 0x18) + (*(long *)(local_958 + 8) + -1) * 0x20));
  for (local_9a0 = 1; local_9a0 < *(long *)(local_958 + 8) - 1U; local_9a0 = local_9a0 + 1) {
    local_a4c = (float)local_9a0;
    local_a54 = (float)(*(long *)(local_958 + 8) - 1);
    fVar5 = 1.0 - local_a4c / local_a54;
    local_638 = (float)local_978._0_8_;
    fStack_634 = (float)((ulong)local_978._0_8_ >> 0x20);
    fStack_630 = (float)local_978._8_8_;
    fStack_62c = (float)((ulong)local_978._8_8_ >> 0x20);
    local_688 = (float)local_768;
    fStack_684 = (float)((ulong)local_768 >> 0x20);
    fStack_680 = (float)uStack_760;
    fStack_67c = (float)((ulong)uStack_760 >> 0x20);
    puVar3 = (undefined8 *)(*(long *)(local_958 + 0x18) + local_9a0 * 0x20);
    uVar1 = *puVar3;
    uVar2 = puVar3[1];
    local_288 = (float)uVar1;
    fStack_284 = (float)((ulong)uVar1 >> 0x20);
    fStack_280 = (float)uVar2;
    fStack_27c = (float)((ulong)uVar2 >> 0x20);
    auVar6._4_4_ = fStack_284 - (fVar5 * fStack_634 + fStack_684);
    auVar6._0_4_ = local_288 - (fVar5 * local_638 + local_688);
    auVar6._12_4_ = fStack_27c - (fVar5 * fStack_62c + fStack_67c);
    auVar6._8_4_ = fStack_280 - (fVar5 * fStack_630 + fStack_680);
    auVar6 = minps(auVar6,ZEXT816(0));
    puVar3 = (undefined8 *)(*(long *)(local_958 + 0x18) + 0x10 + local_9a0 * 0x20);
    uVar1 = *puVar3;
    uVar2 = puVar3[1];
    local_2d8 = (float)uVar1;
    fStack_2d4 = (float)((ulong)uVar1 >> 0x20);
    fStack_2d0 = (float)uVar2;
    fStack_2cc = (float)((ulong)uVar2 >> 0x20);
    local_2e8 = (float)local_7d8;
    fStack_2e4 = (float)((ulong)local_7d8 >> 0x20);
    fStack_2e0 = (float)uStack_7d0;
    fStack_2dc = (float)((ulong)uStack_7d0 >> 0x20);
    auVar4._4_4_ = fStack_2d4 - fStack_2e4;
    auVar4._0_4_ = local_2d8 - local_2e8;
    auVar4._12_4_ = fStack_2cc - fStack_2dc;
    auVar4._8_4_ = fStack_2d0 - fStack_2e0;
    auVar4 = maxps(auVar4,ZEXT816(0));
    local_38 = auVar6._0_4_;
    fStack_34 = auVar6._4_4_;
    fStack_30 = auVar6._8_4_;
    fStack_2c = auVar6._12_4_;
    local_978._0_8_ = CONCAT44(fStack_634 + fStack_34,local_638 + local_38);
    local_978._8_8_ = CONCAT44(fStack_62c + fStack_2c,fStack_630 + fStack_30);
    local_b8 = (float)local_998._0_8_;
    fStack_b4 = (float)((ulong)local_998._0_8_ >> 0x20);
    fStack_b0 = (float)local_998._8_8_;
    fStack_ac = (float)((ulong)local_998._8_8_ >> 0x20);
    local_998._0_8_ = CONCAT44(fStack_b4 + fStack_34,local_b8 + local_38);
    local_998._8_8_ = CONCAT44(fStack_ac + fStack_2c,fStack_b0 + fStack_30);
    local_148 = (float)local_968;
    fStack_144 = (float)((ulong)local_968 >> 0x20);
    fStack_140 = (float)uStack_960;
    fStack_13c = (float)((ulong)uStack_960 >> 0x20);
    local_158 = auVar4._0_4_;
    fStack_154 = auVar4._4_4_;
    fStack_150 = auVar4._8_4_;
    fStack_14c = auVar4._12_4_;
    local_968 = CONCAT44(fStack_144 + fStack_154,local_148 + local_158);
    uStack_960 = CONCAT44(fStack_13c + fStack_14c,fStack_140 + fStack_150);
    local_1d8 = (float)local_988;
    fStack_1d4 = (float)((ulong)local_988 >> 0x20);
    fStack_1d0 = (float)uStack_980;
    fStack_1cc = (float)((ulong)uStack_980 >> 0x20);
    local_988 = CONCAT44(fStack_1d4 + fStack_154,local_1d8 + local_158);
    uStack_980 = CONCAT44(fStack_1cc + fStack_14c,fStack_1d0 + fStack_150);
  }
  *in_RDI = local_978._0_8_;
  in_RDI[1] = local_978._8_8_;
  in_RDI[2] = local_968;
  in_RDI[3] = uStack_960;
  in_RDI[4] = local_998._0_8_;
  in_RDI[5] = local_998._8_8_;
  in_RDI[6] = local_988;
  in_RDI[7] = uStack_980;
  return;
}

Assistant:

LBBox ( const avector<BBox<T>>& bounds ) 
    {
      assert(bounds.size());
      BBox<T> b0 = bounds.front();
      BBox<T> b1 = bounds.back();
      for (size_t i=1; i<bounds.size()-1; i++) {
        const float f = float(i)/float(bounds.size()-1);
        const BBox<T> bt = lerp(b0,b1,f);
        const T dlower = min(bounds[i].lower-bt.lower,T(zero));
        const T dupper = max(bounds[i].upper-bt.upper,T(zero));
        b0.lower += dlower; b1.lower += dlower;
        b0.upper += dupper; b1.upper += dupper;
      }
      bounds0 = b0;
      bounds1 = b1;
    }